

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O1

void __thiscall tst_GenericModel::sortByRole(tst_GenericModel *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QModelIndex *pQVar5;
  GenericModel testModel;
  QPersistentModelIndex oneIndex;
  QPersistentModelIndex fiveIndex;
  ModelTest probe;
  QSignalSpy layoutChangedSpy;
  QSignalSpy layoutAboutToBeChangedSpy;
  anon_union_24_3_e3d07ef4_for_data local_1c8;
  QModelIndex local_1a8;
  QString local_190;
  anon_union_24_3_e3d07ef4_for_data local_178;
  QPersistentModelIndex local_160 [8];
  undefined8 local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined **local_140 [2];
  QSignalSpy local_130;
  QSignalSpy local_b0;
  
  GenericModel::GenericModel((GenericModel *)&local_1a8,(QObject *)0x0);
  QAbstractItemModelTester::QAbstractItemModelTester
            ((QAbstractItemModelTester *)local_140,(QAbstractItemModel *)&local_1a8,QtTest,
             (QObject *)0x0);
  local_140[0] = &PTR_metaObject_001659f8;
  GenericModel::setSortRole((int)&local_1a8);
  QSignalSpy::QSignalSpy(&local_b0,(QObject *)&local_1a8,"2layoutAboutToBeChanged()");
  cVar1 = QTest::qVerify(local_b0.sig.d.size != 0,"layoutAboutToBeChangedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x4a8);
  if (cVar1 != '\0') {
    QSignalSpy::QSignalSpy(&local_130,(QObject *)&local_1a8,"2layoutChanged()");
    cVar1 = QTest::qVerify(local_130.sig.d.size != 0,"layoutChangedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x4aa);
    if (cVar1 != '\0') {
      local_1c8._forAlignment = -NAN;
      local_1c8._8_8_ = 0;
      local_1c8._16_8_ = 0;
      (**(code **)(local_1a8._0_8_ + 0x100))(&local_1a8,0,1);
      local_1c8._forAlignment = -NAN;
      local_1c8._8_8_ = 0;
      local_1c8._16_8_ = 0;
      GenericModel::insertRows((int)&local_1a8,0,(QModelIndex *)0x5);
      local_158 = 0xffffffffffffffff;
      local_150 = 0;
      uStack_148 = 0;
      GenericModel::index((int)&local_178,(int)&local_1a8,(QModelIndex *)0x0);
      QVariant::QVariant((QVariant *)&local_1c8,3);
      iVar4 = (int)&local_1c8;
      GenericModel::setData(&local_1a8,(QVariant *)&local_178,iVar4);
      QVariant::~QVariant((QVariant *)&local_1c8);
      local_158 = 0xffffffffffffffff;
      local_150 = 0;
      uStack_148 = 0;
      GenericModel::index((int)&local_178,(int)&local_1a8,(QModelIndex *)0x1);
      QVariant::QVariant((QVariant *)&local_1c8,1);
      GenericModel::setData(&local_1a8,(QVariant *)&local_178,iVar4);
      QVariant::~QVariant((QVariant *)&local_1c8);
      local_158 = 0xffffffffffffffff;
      local_150 = 0;
      uStack_148 = 0;
      GenericModel::index((int)&local_178,(int)&local_1a8,(QModelIndex *)0x2);
      QVariant::QVariant((QVariant *)&local_1c8,4);
      GenericModel::setData(&local_1a8,(QVariant *)&local_178,iVar4);
      QVariant::~QVariant((QVariant *)&local_1c8);
      local_158 = 0xffffffffffffffff;
      local_150 = 0;
      uStack_148 = 0;
      GenericModel::index((int)&local_178,(int)&local_1a8,(QModelIndex *)0x3);
      QVariant::QVariant((QVariant *)&local_1c8,2);
      GenericModel::setData(&local_1a8,(QVariant *)&local_178,iVar4);
      QVariant::~QVariant((QVariant *)&local_1c8);
      local_158 = 0xffffffffffffffff;
      local_150 = 0;
      uStack_148 = 0;
      GenericModel::index((int)&local_178,(int)&local_1a8,(QModelIndex *)0x4);
      QVariant::QVariant((QVariant *)&local_1c8,5);
      GenericModel::setData(&local_1a8,(QVariant *)&local_178,iVar4);
      QVariant::~QVariant((QVariant *)&local_1c8);
      local_158 = 0xffffffffffffffff;
      local_150 = 0;
      uStack_148 = 0;
      GenericModel::index((int)&local_178,(int)&local_1a8,(QModelIndex *)0x0);
      local_190.d.d = (Data *)0x0;
      local_190.d.ptr = L"Charles";
      local_190.d.size = 7;
      QVariant::QVariant((QVariant *)&local_1c8,&local_190);
      GenericModel::setData(&local_1a8,(QVariant *)&local_178,iVar4);
      QVariant::~QVariant((QVariant *)&local_1c8);
      if (&(local_190.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_190.d.d)->super_QArrayData,2,8);
        }
      }
      local_158 = 0xffffffffffffffff;
      local_150 = 0;
      uStack_148 = 0;
      GenericModel::index((int)&local_178,(int)&local_1a8,(QModelIndex *)0x1);
      local_190.d.d = (Data *)0x0;
      local_190.d.ptr = L"Emma";
      local_190.d.size = 4;
      QVariant::QVariant((QVariant *)&local_1c8,&local_190);
      GenericModel::setData(&local_1a8,(QVariant *)&local_178,iVar4);
      QVariant::~QVariant((QVariant *)&local_1c8);
      if (&(local_190.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_190.d.d)->super_QArrayData,2,8);
        }
      }
      local_158 = 0xffffffffffffffff;
      local_150 = 0;
      uStack_148 = 0;
      GenericModel::index((int)&local_178,(int)&local_1a8,(QModelIndex *)0x2);
      local_190.d.d = (Data *)0x0;
      local_190.d.ptr = L"Bob";
      local_190.d.size = 3;
      QVariant::QVariant((QVariant *)&local_1c8,&local_190);
      GenericModel::setData(&local_1a8,(QVariant *)&local_178,iVar4);
      QVariant::~QVariant((QVariant *)&local_1c8);
      if (&(local_190.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_190.d.d)->super_QArrayData,2,8);
        }
      }
      local_158 = 0xffffffffffffffff;
      local_150 = 0;
      uStack_148 = 0;
      GenericModel::index((int)&local_178,(int)&local_1a8,(QModelIndex *)0x3);
      local_190.d.d = (Data *)0x0;
      local_190.d.ptr = L"Daniel";
      local_190.d.size = 6;
      QVariant::QVariant((QVariant *)&local_1c8,&local_190);
      GenericModel::setData(&local_1a8,(QVariant *)&local_178,iVar4);
      QVariant::~QVariant((QVariant *)&local_1c8);
      if (&(local_190.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_190.d.d)->super_QArrayData,2,8);
        }
      }
      local_158 = 0xffffffffffffffff;
      local_150 = 0;
      uStack_148 = 0;
      GenericModel::index((int)&local_178,(int)&local_1a8,(QModelIndex *)0x4);
      local_190.d.d = (Data *)0x0;
      local_190.d.ptr = L"Alice";
      local_190.d.size = 5;
      QVariant::QVariant((QVariant *)&local_1c8,&local_190);
      GenericModel::setData(&local_1a8,(QVariant *)&local_178,iVar4);
      QVariant::~QVariant((QVariant *)&local_1c8);
      if (&(local_190.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_190.d.d)->super_QArrayData,2,8);
        }
      }
      local_178._forAlignment = -NAN;
      local_178._8_8_ = 0;
      local_178._16_8_ = 0;
      GenericModel::index(iVar4,(int)&local_1a8,(QModelIndex *)0x1);
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)&local_190,(QModelIndex *)&local_1c8);
      local_178._forAlignment = -NAN;
      local_178._8_8_ = 0;
      local_178._16_8_ = 0;
      GenericModel::index(iVar4,(int)&local_1a8,(QModelIndex *)0x4);
      QPersistentModelIndex::QPersistentModelIndex(local_160,(QModelIndex *)&local_1c8);
      QPersistentModelIndex::data(iVar4);
      iVar2 = QVariant::toInt((bool *)local_1c8.data);
      cVar1 = QTest::qCompare(iVar2,1,"oneIndex.data().toInt()","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x4ba);
      QVariant::~QVariant((QVariant *)&local_1c8);
      if (cVar1 != '\0') {
        QPersistentModelIndex::data(iVar4);
        iVar2 = QVariant::toInt((bool *)local_1c8.data);
        cVar1 = QTest::qCompare(iVar2,5,"fiveIndex.data().toInt()","5",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x4bb);
        QVariant::~QVariant((QVariant *)&local_1c8);
        if (cVar1 != '\0') {
          GenericModel::sort((int)&local_1a8,AscendingOrder);
          cVar1 = QTest::qCompare(local_b0.super_QList<QList<QVariant>_>.d.size,1,
                                  "layoutAboutToBeChangedSpy.count()","1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x4be);
          if (cVar1 != '\0') {
            cVar1 = QTest::qCompare(local_130.super_QList<QList<QVariant>_>.d.size,1,
                                    "layoutChangedSpy.count()","1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x4bf);
            if (cVar1 != '\0') {
              pQVar5 = (QModelIndex *)0x0;
              iVar2 = 5;
              do {
                local_158 = 0xffffffffffffffff;
                local_150 = 0;
                uStack_148 = 0;
                GenericModel::index((int)&local_178,(int)&local_1a8,pQVar5);
                GenericModel::data((QModelIndex *)&local_1c8,(int)&local_1a8);
                iVar3 = QVariant::toInt((bool *)local_1c8.data);
                cVar1 = QTest::qCompare(iVar3,iVar2,"testModel.data(testModel.index(i, 0)).toInt()",
                                        "5 - i",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x4c1);
                QVariant::~QVariant((QVariant *)&local_1c8);
                if (cVar1 == '\0') goto LAB_0011a164;
                pQVar5 = (QModelIndex *)(ulong)((int)pQVar5 + 1);
                iVar2 = iVar2 + -1;
              } while (iVar2 != 0);
              QPersistentModelIndex::data(iVar4);
              iVar2 = QVariant::toInt((bool *)local_1c8.data);
              cVar1 = QTest::qCompare(iVar2,1,"oneIndex.data().toInt()","1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x4c2);
              QVariant::~QVariant((QVariant *)&local_1c8);
              if (cVar1 != '\0') {
                QPersistentModelIndex::data(iVar4);
                iVar4 = QVariant::toInt((bool *)local_1c8.data);
                cVar1 = QTest::qCompare(iVar4,5,"fiveIndex.data().toInt()","5",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x4c3);
                QVariant::~QVariant((QVariant *)&local_1c8);
                if (cVar1 != '\0') {
                  iVar4 = QPersistentModelIndex::row();
                  cVar1 = QTest::qCompare(iVar4,4,"oneIndex.row()","4",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x4c4);
                  if (cVar1 != '\0') {
                    iVar4 = QPersistentModelIndex::row();
                    QTest::qCompare(iVar4,0,"fiveIndex.row()","0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x4c5);
                  }
                }
              }
            }
          }
        }
      }
LAB_0011a164:
      QPersistentModelIndex::~QPersistentModelIndex(local_160);
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_190);
    }
    local_130._0_8_ = &PTR_metaObject_00165910;
    QObject::~QObject((QObject *)((long)&local_130 + 0x58));
    if (&(local_130.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_130.args.d.d)->super_QArrayData,4,8);
      }
    }
    if (&(local_130.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_130.sig.d.d)->super_QArrayData,1,8);
      }
    }
    QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
              ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_130 + 0x10));
    QObject::~QObject(&local_130.super_QObject);
  }
  local_b0._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject((QObject *)((long)&local_b0 + 0x58));
  if (&(local_b0.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_b0.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_b0 + 0x10));
  QObject::~QObject(&local_b0.super_QObject);
  QObject::~QObject((QObject *)local_140);
  GenericModel::~GenericModel((GenericModel *)&local_1a8);
  return;
}

Assistant:

void tst_GenericModel::sortByRole()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    testModel.setSortRole(Qt::UserRole);
    QSignalSpy layoutAboutToBeChangedSpy(&testModel, SIGNAL(layoutAboutToBeChanged()));
    QVERIFY(layoutAboutToBeChangedSpy.isValid());
    QSignalSpy layoutChangedSpy(&testModel, SIGNAL(layoutChanged()));
    QVERIFY(layoutChangedSpy.isValid());

    testModel.insertColumn(0);
    testModel.insertRows(0, 5);
    testModel.setData(testModel.index(0, 0), 3);
    testModel.setData(testModel.index(1, 0), 1);
    testModel.setData(testModel.index(2, 0), 4);
    testModel.setData(testModel.index(3, 0), 2);
    testModel.setData(testModel.index(4, 0), 5);
    testModel.setData(testModel.index(0, 0), QStringLiteral("Charles"), Qt::UserRole);
    testModel.setData(testModel.index(1, 0), QStringLiteral("Emma"), Qt::UserRole);
    testModel.setData(testModel.index(2, 0), QStringLiteral("Bob"), Qt::UserRole);
    testModel.setData(testModel.index(3, 0), QStringLiteral("Daniel"), Qt::UserRole);
    testModel.setData(testModel.index(4, 0), QStringLiteral("Alice"), Qt::UserRole);
    QPersistentModelIndex oneIndex(testModel.index(1, 0));
    QPersistentModelIndex fiveIndex(testModel.index(4, 0));
    QCOMPARE(oneIndex.data().toInt(), 1);
    QCOMPARE(fiveIndex.data().toInt(), 5);

    testModel.sort(0, Qt::AscendingOrder);
    QCOMPARE(layoutAboutToBeChangedSpy.count(), 1);
    QCOMPARE(layoutChangedSpy.count(), 1);
    for (int i = 0; i < 5; ++i)
        QCOMPARE(testModel.data(testModel.index(i, 0)).toInt(), 5 - i);
    QCOMPARE(oneIndex.data().toInt(), 1);
    QCOMPARE(fiveIndex.data().toInt(), 5);
    QCOMPARE(oneIndex.row(), 4);
    QCOMPARE(fiveIndex.row(), 0);
}